

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture1DView *src,float *texCoord,ReferenceParams *params)

{
  Sampler *sampler;
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  LodMode mode;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  long lVar8;
  ulong uVar9;
  undefined4 uVar10;
  deInt32 srcSize;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ChannelType CVar22;
  float fVar23;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  float fVar26;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar24 [16];
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  Texture1DView TVar46;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture1DView view;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  Vec3 local_128;
  Vec3 VStack_11c;
  undefined1 local_108 [20];
  float afStack_f4 [3];
  void *local_e8;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_d8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  Texture1DView local_70;
  IVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  iVar19 = params->baseLevel;
  iVar12 = params->maxLevel;
  iVar16 = src->m_numLevels + -1;
  iVar18 = iVar16;
  if (iVar19 < iVar16) {
    iVar18 = iVar19;
  }
  iVar17 = 0;
  if (-1 < iVar19) {
    iVar17 = iVar18;
  }
  if (iVar12 < iVar16) {
    iVar16 = iVar12;
  }
  local_70.m_numLevels = 1;
  if (iVar17 <= iVar12) {
    local_70.m_numLevels = (iVar16 - iVar17) + 1;
  }
  local_70.m_levels = src->m_levels + iVar17;
  auVar31 = *(undefined1 (*) [16])texCoord;
  sampler = &params->sampler;
  local_148 = auVar31._0_4_;
  fStack_144 = auVar31._4_4_;
  fStack_140 = auVar31._8_4_;
  fStack_13c = auVar31._12_4_;
  if (((params->super_RenderParams).flags & 1) == 0) {
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar46 = tcu::getEffectiveTextureView(&local_70,&local_d8,sampler);
    uVar20 = TVar46.m_numLevels;
    local_98._0_8_ = 0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_98._0_8_ = ZEXT48((uint)(params->super_RenderParams).bias);
    }
    mode = dst->m_width;
    uVar21 = dst->m_height;
    local_98._8_8_ = 0;
    if ((int)uVar20 < 1) {
      srcSize = 0;
    }
    else {
      srcSize = ((TVar46.m_levels)->m_size).m_data[0];
    }
    local_128.m_data[0] = local_148;
    local_128.m_data[1] = fStack_144;
    local_128.m_data[2] = fStack_140;
    VStack_11c.m_data[0] = fStack_13c;
    VStack_11c.m_data[2] = fStack_144;
    VStack_11c.m_data[1] = fStack_140;
    local_a8._0_4_ =
         computeNonProjectedTriLod
                   ((TextureTestUtil *)(ulong)params->lodMode,mode,(IVec2 *)(ulong)uVar21,srcSize,
                    &local_128);
    local_a8._4_4_ = extraout_XMM0_Db;
    uStack_a0 = extraout_XMM0_Dc;
    uStack_9c = extraout_XMM0_Dd;
    uVar10 = params->minLod;
    local_b8 = ZEXT416((uint)params->maxLod);
    fVar23 = computeNonProjectedTriLod
                       ((TextureTestUtil *)(ulong)params->lodMode,mode,(IVec2 *)(ulong)uVar21,
                        srcSize,&VStack_11c);
    auVar30._4_4_ = params->maxLod;
    auVar30._0_4_ = local_b8._0_4_;
    auVar30._8_4_ = local_b8._4_4_;
    auVar30._12_4_ = 0;
    auVar6._4_4_ = fVar23 + (float)local_98._0_4_;
    auVar6._0_4_ = (float)local_a8._0_4_ + (float)local_98._0_4_;
    auVar6._8_4_ = (float)local_a8._4_4_ + (float)local_98._0_4_;
    auVar6._12_4_ = extraout_XMM0_Db_00 + (float)local_98._0_4_;
    auVar31 = minps(auVar30,auVar6);
    uVar21 = -(uint)((float)local_a8._0_4_ + (float)local_98._0_4_ < (float)uVar10);
    CVar22 = -(uint)(fVar23 + (float)local_98._0_4_ < params->minLod);
    local_108._0_4_ = ~uVar21 & auVar31._0_4_ | uVar10 & uVar21;
    local_108._4_4_ = ~CVar22 & auVar31._4_4_ | (uint)params->minLod & CVar22;
    iVar19 = dst->m_height;
    if (0 < iVar19) {
      iVar12 = dst->m_width;
      iVar18 = 0;
      do {
        if (0 < iVar12) {
          iVar19 = 0;
          do {
            auVar28._0_4_ = (float)iVar19 + 0.5;
            auVar28._4_4_ = (float)iVar18 + 0.5;
            auVar28._8_8_ = 0;
            auVar24._0_4_ = (float)iVar12;
            auVar24._4_4_ = (float)dst->m_height;
            auVar24._8_8_ = 0;
            auVar31 = divps(auVar28,auVar24);
            fVar23 = auVar31._4_4_;
            bVar5 = 1.0 <= auVar31._0_4_ + fVar23;
            if (bVar5) {
              auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
              if (bVar5) goto LAB_009f1e0a;
LAB_009f1e19:
              fVar25 = auVar31._0_4_;
            }
            else {
              if (!bVar5) goto LAB_009f1e19;
LAB_009f1e0a:
              fVar25 = auVar31._0_4_;
              fVar23 = 1.0 - fVar23;
            }
            uVar9 = (ulong)bVar5;
            fVar26 = (&local_128)[uVar9].m_data[0];
            fVar23 = ((&local_128)[uVar9].m_data[1] - fVar26) * fVar23 +
                     ((&VStack_11c)[uVar9 - 1].m_data[2] - fVar26) * fVar25 + fVar26;
            if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
              local_88._0_4_ = 0;
              local_88._4_4_ = 0;
              local_108._16_4_ =
                   tcu::sampleLevelArray1DCompare
                             (TVar46.m_levels,uVar20,sampler,(params->super_RenderParams).ref,fVar23
                              ,*(float *)(local_108 + uVar9 * 4),(IVec2 *)local_88);
              afStack_f4[0] = 0.0;
              afStack_f4[1] = 0.0;
              afStack_f4[2] = 1.0;
            }
            else {
              tcu::sampleLevelArray1D
                        ((ConstPixelBufferAccess *)(local_108 + 0x10),(int)TVar46.m_levels,
                         (Sampler *)(ulong)uVar20,fVar23,(int)sampler,
                         *(float *)(local_108 + uVar9 * 4));
            }
            fVar23 = (params->super_RenderParams).colorScale.m_data[0] * (float)local_108._16_4_ +
                     (params->super_RenderParams).colorBias.m_data[0];
            fVar25 = (params->super_RenderParams).colorScale.m_data[1] * afStack_f4[0] +
                     (params->super_RenderParams).colorBias.m_data[1];
            fVar26 = (params->super_RenderParams).colorScale.m_data[2] * afStack_f4[1] +
                     (params->super_RenderParams).colorBias.m_data[2];
            fVar27 = (params->super_RenderParams).colorScale.m_data[3] * afStack_f4[2] +
                     (params->super_RenderParams).colorBias.m_data[3];
            bVar4 = dst->m_colorMask;
            uVar11 = 0;
            uVar21 = 0;
            if ((bVar4 & 1) != 0) {
              uVar13 = 0x7e - ((int)fVar23 >> 0x17);
              uVar21 = (((uint)fVar23 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar21 = uVar13;
              }
              uVar21 = uVar21 >> 0x18;
            }
            if ((bVar4 & 2) != 0) {
              uVar13 = 0x7e - ((int)fVar25 >> 0x17);
              uVar11 = (((uint)fVar25 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar11 = uVar13;
              }
              uVar11 = uVar11 >> 0x10 & 0xff00;
            }
            uVar13 = 0;
            if ((bVar4 & 4) != 0) {
              uVar14 = 0x7e - ((int)fVar26 >> 0x17);
              uVar13 = (((uint)fVar26 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                       0x800000;
              if (8 < uVar14) {
                uVar13 = uVar14;
              }
              uVar13 = uVar13 >> 8 & 0xff0000;
            }
            uVar14 = 0xff000000;
            if ((bVar4 & 8) != 0) {
              uVar15 = 0x7e - ((int)fVar27 >> 0x17);
              uVar14 = (((uint)fVar27 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                       0x800000;
              if (8 < uVar15) {
                uVar14 = uVar15;
              }
              uVar14 = uVar14 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)(dst->m_x + iVar19 + (dst->m_y + iVar18) * dst->m_surface->m_width) * 4)
                 = uVar11 | uVar21 | uVar13 | uVar14;
            iVar19 = iVar19 + 1;
            iVar12 = dst->m_width;
          } while (iVar19 < iVar12);
          iVar19 = dst->m_height;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar19);
    }
  }
  else {
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar46 = tcu::getEffectiveTextureView(&local_70,&local_d8,sampler);
    local_b8._0_4_ = TVar46.m_numLevels;
    fVar23 = 0.0;
    _local_a8 = ZEXT816(0);
    if (((params->super_RenderParams).flags & 2) != 0) {
      _local_a8 = ZEXT416((uint)(params->super_RenderParams).bias);
    }
    iVar19 = dst->m_height;
    if (0 < TVar46.m_numLevels) {
      fVar23 = (float)((TVar46.m_levels)->m_size).m_data[0];
    }
    iVar12 = dst->m_width;
    local_128.m_data[0] = local_148;
    local_128.m_data[1] = fStack_144;
    local_128.m_data[2] = fStack_140;
    VStack_11c.m_data[0] = fStack_13c;
    VStack_11c.m_data[2] = fStack_144;
    VStack_11c.m_data[1] = fStack_140;
    local_108._16_4_ = fVar23 * local_148;
    afStack_f4[1] = fVar23 * fStack_140;
    afStack_f4[0] = fVar23 * fStack_144;
    afStack_f4[2] = fVar23 * fStack_13c;
    local_e8 = (void *)CONCAT44(fVar23 * fStack_144,fVar23 * fStack_140);
    fStack_80 = (params->super_RenderParams).w.m_data[2];
    local_88 = (undefined1  [8])*(int (*) [2])(params->super_RenderParams).w.m_data;
    fStack_7c = (params->super_RenderParams).w.m_data[3];
    local_78 = CONCAT44((params->super_RenderParams).w.m_data[1],fStack_80);
    if (0 < iVar19) {
      fVar23 = (float)iVar12;
      fVar25 = (float)iVar19;
      iVar18 = 0;
      do {
        if (0 < iVar12) {
          fVar26 = (float)iVar18 + 0.5;
          local_48._0_16_ = ZEXT416((uint)fVar26);
          fVar27 = fVar26 / fVar25;
          local_98 = ZEXT416((uint)fVar27);
          local_58 = ZEXT416((uint)(fVar25 - fVar26));
          iVar19 = 0;
          do {
            fVar37 = (float)iVar19 + 0.5;
            fVar26 = fVar37 / fVar23;
            fVar40 = (float)local_98._0_4_ + fVar26;
            bVar5 = 1.0 <= fVar40;
            fVar39 = (float)local_98._0_4_;
            if (bVar5) {
              fVar26 = 1.0 - fVar26;
              fVar39 = 1.0 - fVar27;
            }
            lVar8 = (ulong)((uint)bVar5 * 4) * 3;
            fVar1 = *(float *)(local_88 + lVar8);
            fVar32 = (float)*(undefined8 *)(local_88 + lVar8 + 4);
            fVar33 = (float)((ulong)*(undefined8 *)(local_88 + lVar8 + 4) >> 0x20);
            fVar38 = 0.0;
            if (params->lodMode < LODMODE_LAST) {
              fVar38 = (float)(~-(uint)(1.0 <= fVar40) & local_48._0_4_ |
                              -(uint)(1.0 <= fVar40) & local_58._0_4_);
              if (1.0 <= fVar40) {
                fVar37 = fVar23 - fVar37;
              }
              uVar9 = (ulong)bVar5;
              fVar29 = (float)dst->m_height;
              fVar41 = (float)iVar12;
              fVar40 = afStack_f4[uVar9 * 3 + -1];
              fVar2 = afStack_f4[uVar9 * 3];
              fVar42 = fVar37 / fVar41;
              fVar3 = afStack_f4[uVar9 * 3 + 1];
              fVar43 = fVar1 * fVar32 * fVar33;
              fVar44 = (fVar29 * (fVar42 + -1.0) + fVar38) * fVar32 * fVar33 +
                       -fVar1 * (fVar42 * fVar32 * fVar29 + fVar38 * fVar33);
              fVar45 = (fVar33 * 0.0 + (float)local_48._4_4_ * 0.0) * -0.0 + 0.0;
              fVar42 = fVar43 * fVar29 *
                       ((fVar42 + -1.0) * fVar33 * (fVar40 - fVar2) +
                       fVar42 * (fVar1 * (fVar2 - fVar3) + (fVar3 - fVar40) * fVar32));
              fVar44 = fVar44 * fVar44;
              fVar45 = fVar45 * fVar45;
              fVar38 = fVar38 / fVar29;
              fVar37 = fVar32 * fVar33 * ((fVar38 + -1.0) * fVar41 + fVar37) -
                       (fVar41 * fVar33 * fVar38 + fVar37 * fVar32) * fVar1;
              auVar34._4_4_ = fVar44;
              auVar34._0_4_ = fVar42;
              auVar34._8_4_ = 0;
              auVar34._12_4_ = fVar45;
              auVar7._4_8_ = auVar34._8_8_;
              auVar7._0_4_ = fVar42;
              auVar35._0_8_ = auVar7._0_8_ << 0x20;
              auVar35._8_4_ = fVar42;
              auVar35._12_4_ = fVar42;
              auVar36._4_12_ = auVar35._4_12_;
              auVar36._0_4_ =
                   ((fVar40 - fVar3) * fVar32 * (fVar38 + -1.0) +
                   ((fVar2 - fVar40) * fVar33 + (fVar3 - fVar2) * fVar1) * fVar38) * fVar43 * fVar41
              ;
              auVar31._4_4_ = fVar44;
              auVar31._0_4_ = fVar37 * fVar37;
              auVar31._8_4_ = 0;
              auVar31._12_4_ = fVar45;
              auVar31 = divps(auVar36,auVar31);
              fVar37 = auVar31._0_4_;
              fVar40 = auVar31._4_4_;
              uVar20 = -(uint)(-fVar37 <= fVar37);
              uVar21 = -(uint)(-fVar40 <= fVar40);
              fVar37 = (float)(~uVar20 & (uint)-fVar37 | (uint)fVar37 & uVar20);
              fVar40 = (float)(~uVar21 & (uint)-fVar40 | (uint)fVar40 & uVar21);
              uVar20 = -(uint)(fVar40 <= fVar37);
              fVar38 = (float)(~uVar20 & (uint)fVar40 | (uint)fVar37 & uVar20);
            }
            fVar37 = (1.0 - fVar26) - fVar39;
            fVar39 = ((*(float *)((long)VStack_11c.m_data + lVar8 + -4) * fVar26) / fVar33 +
                     (*(float *)((long)local_128.m_data + lVar8 + 4) * fVar39) / fVar32 +
                     (*(float *)((long)local_128.m_data + lVar8) * fVar37) / fVar1) /
                     (fVar26 / fVar33 + fVar39 / fVar32 + fVar37 / fVar1);
            fVar26 = logf(fVar38);
            fVar26 = fVar26 * 1.442695 + (float)local_a8._0_4_;
            if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
              local_60.m_data[0] = 0;
              local_60.m_data[1] = 0;
              local_108._0_4_ =
                   tcu::sampleLevelArray1DCompare
                             (TVar46.m_levels,local_b8._0_4_,sampler,
                              (params->super_RenderParams).ref,fVar39,fVar26,&local_60);
              local_108._4_4_ = SNORM_INT8;
              local_108._8_4_ = 0;
              local_108._12_4_ = 1.0;
            }
            else {
              tcu::sampleLevelArray1D
                        ((ConstPixelBufferAccess *)local_108,(int)TVar46.m_levels,
                         (Sampler *)(ulong)(uint)local_b8._0_4_,fVar39,(int)sampler,fVar26);
            }
            fVar26 = (params->super_RenderParams).colorScale.m_data[0] * (float)local_108._0_4_ +
                     (params->super_RenderParams).colorBias.m_data[0];
            fVar39 = (params->super_RenderParams).colorScale.m_data[1] * (float)local_108._4_4_ +
                     (params->super_RenderParams).colorBias.m_data[1];
            fVar37 = (params->super_RenderParams).colorScale.m_data[2] * (float)local_108._8_4_ +
                     (params->super_RenderParams).colorBias.m_data[2];
            fVar40 = (params->super_RenderParams).colorScale.m_data[3] * (float)local_108._12_4_ +
                     (params->super_RenderParams).colorBias.m_data[3];
            bVar4 = dst->m_colorMask;
            uVar21 = 0;
            uVar20 = 0;
            if ((bVar4 & 1) != 0) {
              uVar11 = 0x7e - ((int)fVar26 >> 0x17);
              uVar20 = (((uint)fVar26 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar11 & 0x1f)) +
                       0x800000;
              if (8 < uVar11) {
                uVar20 = uVar11;
              }
              uVar20 = uVar20 >> 0x18;
            }
            if ((bVar4 & 2) != 0) {
              uVar11 = 0x7e - ((int)fVar39 >> 0x17);
              uVar21 = (((uint)fVar39 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar11 & 0x1f)) +
                       0x800000;
              if (8 < uVar11) {
                uVar21 = uVar11;
              }
              uVar21 = uVar21 >> 0x10 & 0xff00;
            }
            uVar11 = 0;
            if ((bVar4 & 4) != 0) {
              uVar13 = 0x7e - ((int)fVar37 >> 0x17);
              uVar11 = (((uint)fVar37 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar11 = uVar13;
              }
              uVar11 = uVar11 >> 8 & 0xff0000;
            }
            uVar13 = 0xff000000;
            if ((bVar4 & 8) != 0) {
              uVar14 = 0x7e - ((int)fVar40 >> 0x17);
              uVar13 = (((uint)fVar40 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                       0x800000;
              if (8 < uVar14) {
                uVar13 = uVar14;
              }
              uVar13 = uVar13 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)(dst->m_x + iVar19 + (dst->m_y + iVar18) * dst->m_surface->m_width) * 4)
                 = uVar21 | uVar20 | uVar11 | uVar13;
            iVar19 = iVar19 + 1;
            iVar12 = dst->m_width;
          } while (iVar19 < iVar12);
          iVar19 = dst->m_height;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar19);
    }
  }
  if (local_d8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture1DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture1DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, params);
	else
		sampleTextureNonProjected(dst, view, sq, params);
}